

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void * op_url_stream_vcreate_impl
                 (OpusFileCallbacks *_cb,char *_url,OpusServerInfo *_info,OpusServerInfo **_pinfo,
                 __va_list_tag *_ap)

{
  uint uVar1;
  long lVar2;
  void *pvVar3;
  ptrdiff_t *local_128;
  undefined8 *local_110;
  undefined8 *local_f8;
  uint *local_e0;
  undefined8 *local_c8;
  int *local_b0;
  long *local_90;
  void *ret;
  ptrdiff_t request;
  OpusServerInfo *pinfo;
  char *proxy_pass;
  char *proxy_user;
  char *pcStack_48;
  opus_int32 proxy_port;
  char *proxy_host;
  int skip_certificate_check;
  __va_list_tag *_ap_local;
  OpusServerInfo **_pinfo_local;
  OpusServerInfo *_info_local;
  char *_url_local;
  OpusFileCallbacks *_cb_local;
  
  proxy_host._4_4_ = 0;
  pcStack_48 = (char *)0x0;
  proxy_user._4_4_ = 0x1f90;
  proxy_pass = (char *)0x0;
  pinfo = (OpusServerInfo *)0x0;
  request = 0;
  *_pinfo = (OpusServerInfo *)0x0;
  while( true ) {
    uVar1 = _ap->gp_offset;
    if (uVar1 < 0x29) {
      local_90 = (long *)((long)(int)uVar1 + (long)_ap->reg_save_area);
      _ap->gp_offset = uVar1 + 8;
    }
    else {
      local_90 = (long *)_ap->overflow_arg_area;
      _ap->overflow_arg_area = local_90 + 1;
    }
    lVar2 = *local_90;
    if (lVar2 == 0) break;
    if (lVar2 == 0x1940) {
      uVar1 = _ap->gp_offset;
      if (uVar1 < 0x29) {
        local_b0 = (int *)((long)(int)uVar1 + (long)_ap->reg_save_area);
        _ap->gp_offset = uVar1 + 8;
      }
      else {
        local_b0 = (int *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = local_b0 + 2;
      }
      proxy_host._4_4_ = (uint)(*local_b0 != 0);
    }
    else if (lVar2 == 0x1980) {
      uVar1 = _ap->gp_offset;
      if (uVar1 < 0x29) {
        local_c8 = (undefined8 *)((long)(int)uVar1 + (long)_ap->reg_save_area);
        _ap->gp_offset = uVar1 + 8;
      }
      else {
        local_c8 = (undefined8 *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = local_c8 + 1;
      }
      pcStack_48 = (char *)*local_c8;
    }
    else if (lVar2 == 0x19c0) {
      uVar1 = _ap->gp_offset;
      if (uVar1 < 0x29) {
        local_e0 = (uint *)((long)(int)uVar1 + (long)_ap->reg_save_area);
        _ap->gp_offset = uVar1 + 8;
      }
      else {
        local_e0 = (uint *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = local_e0 + 2;
      }
      proxy_user._4_4_ = *local_e0;
      if (((int)proxy_user._4_4_ < 0) || (0xffff < (int)proxy_user._4_4_)) {
        return (void *)0x0;
      }
    }
    else if (lVar2 == 0x1a00) {
      uVar1 = _ap->gp_offset;
      if (uVar1 < 0x29) {
        local_f8 = (undefined8 *)((long)(int)uVar1 + (long)_ap->reg_save_area);
        _ap->gp_offset = uVar1 + 8;
      }
      else {
        local_f8 = (undefined8 *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = local_f8 + 1;
      }
      proxy_pass = (char *)*local_f8;
    }
    else if (lVar2 == 0x1a40) {
      uVar1 = _ap->gp_offset;
      if (uVar1 < 0x29) {
        local_110 = (undefined8 *)((long)(int)uVar1 + (long)_ap->reg_save_area);
        _ap->gp_offset = uVar1 + 8;
      }
      else {
        local_110 = (undefined8 *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = local_110 + 1;
      }
      pinfo = (OpusServerInfo *)*local_110;
    }
    else {
      if (lVar2 != 0x1a80) {
        return (void *)0x0;
      }
      uVar1 = _ap->gp_offset;
      if (uVar1 < 0x29) {
        local_128 = (ptrdiff_t *)((long)(int)uVar1 + (long)_ap->reg_save_area);
        _ap->gp_offset = uVar1 + 8;
      }
      else {
        local_128 = (ptrdiff_t *)_ap->overflow_arg_area;
        _ap->overflow_arg_area = local_128 + 1;
      }
      request = *local_128;
    }
  }
  if (request == 0) {
    pvVar3 = op_url_stream_create_impl
                       (_cb,_url,proxy_host._4_4_,pcStack_48,proxy_user._4_4_,proxy_pass,
                        (char *)pinfo,(OpusServerInfo *)0x0);
    return pvVar3;
  }
  opus_server_info_init(_info);
  pvVar3 = op_url_stream_create_impl
                     (_cb,_url,proxy_host._4_4_,pcStack_48,proxy_user._4_4_,proxy_pass,(char *)pinfo
                      ,_info);
  if (pvVar3 != (void *)0x0) {
    *_pinfo = (OpusServerInfo *)request;
    return pvVar3;
  }
  opus_server_info_clear(_info);
  return (void *)0x0;
}

Assistant:

static void *op_url_stream_vcreate_impl(OpusFileCallbacks *_cb,
 const char *_url,OpusServerInfo *_info,OpusServerInfo **_pinfo,va_list _ap){
  int             skip_certificate_check;
  const char     *proxy_host;
  opus_int32      proxy_port;
  const char     *proxy_user;
  const char     *proxy_pass;
  OpusServerInfo *pinfo;
  skip_certificate_check=0;
  proxy_host=NULL;
  proxy_port=8080;
  proxy_user=NULL;
  proxy_pass=NULL;
  pinfo=NULL;
  *_pinfo=NULL;
  for(;;){
    ptrdiff_t request;
    request=va_arg(_ap,char *)-(char *)NULL;
    /*If we hit NULL, we're done processing options.*/
    if(!request)break;
    switch(request){
      case OP_SSL_SKIP_CERTIFICATE_CHECK_REQUEST:{
        skip_certificate_check=!!va_arg(_ap,opus_int32);
      }break;
      case OP_HTTP_PROXY_HOST_REQUEST:{
        proxy_host=va_arg(_ap,const char *);
      }break;
      case OP_HTTP_PROXY_PORT_REQUEST:{
        proxy_port=va_arg(_ap,opus_int32);
        if(proxy_port<0||proxy_port>(opus_int32)65535)return NULL;
      }break;
      case OP_HTTP_PROXY_USER_REQUEST:{
        proxy_user=va_arg(_ap,const char *);
      }break;
      case OP_HTTP_PROXY_PASS_REQUEST:{
        proxy_pass=va_arg(_ap,const char *);
      }break;
      case OP_GET_SERVER_INFO_REQUEST:{
        pinfo=va_arg(_ap,OpusServerInfo *);
      }break;
      /*Some unknown option.*/
      default:return NULL;
    }
  }
  /*If the caller has requested server information, proxy it to a local copy to
     simplify error handling.*/
  if(pinfo!=NULL){
    void *ret;
    opus_server_info_init(_info);
    ret=op_url_stream_create_impl(_cb,_url,skip_certificate_check,
     proxy_host,proxy_port,proxy_user,proxy_pass,_info);
    if(ret!=NULL)*_pinfo=pinfo;
    else opus_server_info_clear(_info);
    return ret;
  }
  return op_url_stream_create_impl(_cb,_url,skip_certificate_check,
   proxy_host,proxy_port,proxy_user,proxy_pass,NULL);
}